

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Areal_Object_State_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Areal_Object_State_PDU::Decode
          (Areal_Object_State_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  pointer pWVar1;
  pointer pWVar2;
  KUINT16 KVar3;
  KException *this_00;
  int iVar4;
  undefined7 in_register_00000011;
  ushort uVar5;
  pointer pWVar6;
  WorldCoordinates local_50;
  
  KVar3 = KDataStream::GetBufferSize(stream);
  iVar4 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar4 = 0;
  }
  if (iVar4 + (uint)KVar3 < 0x30) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    local_50.super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&local_50.m_f64Y;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Decode","");
    KException::KException(this_00,(KString *)&local_50,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pWVar1 = (this->m_vPoints).
           super__Vector_base<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pWVar2 = (this->m_vPoints).
           super__Vector_base<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pWVar6 = pWVar1;
  if (pWVar2 != pWVar1) {
    do {
      (**(pWVar6->super_DataTypeBase)._vptr_DataTypeBase)(pWVar6);
      pWVar6 = pWVar6 + 1;
    } while (pWVar6 != pWVar2);
    (this->m_vPoints).
    super__Vector_base<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
    ._M_impl.super__Vector_impl_data._M_finish = pWVar1;
  }
  Object_State_Header::Decode(&this->super_Object_State_Header,stream,ignoreHeader);
  KDataStream::Read(stream,&(this->super_Object_State_Header).field_0x4b);
  (*(this->m_ObjTyp).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_ObjTyp,stream);
  (*(this->m_Apperance).super_ObjectAppearance.super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_Apperance,stream);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16NumPoints);
  (*(this->m_ReqID).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_ReqID,stream);
  (*(this->m_RecvID).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_RecvID,stream);
  if (this->m_ui16NumPoints != 0) {
    uVar5 = 0;
    do {
      DATA_TYPE::WorldCoordinates::WorldCoordinates(&local_50,stream);
      std::
      vector<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
      ::emplace_back<KDIS::DATA_TYPE::WorldCoordinates>(&this->m_vPoints,&local_50);
      DATA_TYPE::DataTypeBase::~DataTypeBase(&local_50.super_DataTypeBase);
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->m_ui16NumPoints);
  }
  return;
}

Assistant:

void Areal_Object_State_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < AREAL_OBJECT_STATE_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vPoints.clear();

    Object_State_Header::Decode( stream, ignoreHeader );

    stream >> m_ModificationUnion.m_ui8Modifications
           >> KDIS_STREAM m_ObjTyp
           >> KDIS_STREAM m_Apperance
           >> m_ui16NumPoints
           >> KDIS_STREAM m_ReqID
           >> KDIS_STREAM m_RecvID;

    for( KUINT16 i = 0; i < m_ui16NumPoints; ++i )
    {
        m_vPoints.push_back( WorldCoordinates( stream ) );
    }
}